

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_Model.cpp
# Opt level: O0

bool __thiscall Opcode::Model::Build(Model *this,OPCODECREATE *create)

{
  udword uVar1;
  AABBOptimizedTree *pAVar2;
  bool bVar3;
  uint uVar4;
  AABBTree *pAVar5;
  undefined1 local_80 [8];
  AABBTreeOfTrianglesBuilder TB;
  udword NbTris;
  udword NbDegenerate;
  OPCODECREATE *create_local;
  Model *this_local;
  
  if ((create->mIMesh == (MeshInterface *)0x0) ||
     (bVar3 = MeshInterface::IsValid(create->mIMesh), !bVar3)) {
    this_local._7_1_ = 0;
  }
  else if ((create->mSettings).mLimit == 1) {
    MeshInterface::CheckTopology(create->mIMesh);
    Release(this);
    (this->super_BaseModel).mIMesh = create->mIMesh;
    uVar1 = create->mIMesh->mNbTris;
    if (uVar1 == 1) {
      (this->super_BaseModel).mModelCode = (this->super_BaseModel).mModelCode | 4;
      this_local._7_1_ = 1;
    }
    else {
      pAVar5 = (AABBTree *)operator_new(0x48);
      AABBTree::AABBTree(pAVar5);
      (this->super_BaseModel).mSource = pAVar5;
      if ((this->super_BaseModel).mSource == (AABBTree *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        AABBTreeOfTrianglesBuilder::AABBTreeOfTrianglesBuilder
                  ((AABBTreeOfTrianglesBuilder *)local_80);
        TB.super_AABBTreeBuilder._32_8_ = create->mIMesh;
        TB.super_AABBTreeBuilder._vptr_AABBTreeBuilder = *(_func_int ***)&create->mSettings;
        TB.super_AABBTreeBuilder.mSettings.mLimit = uVar1;
        bVar3 = AABBTree::Build((this->super_BaseModel).mSource,(AABBTreeBuilder *)local_80);
        if (!bVar3) {
          this_local._7_1_ = 0;
        }
        AABBTreeOfTrianglesBuilder::~AABBTreeOfTrianglesBuilder
                  ((AABBTreeOfTrianglesBuilder *)local_80);
        if (bVar3) {
          bVar3 = BaseModel::CreateTree
                            (&this->super_BaseModel,(bool)(create->mNoLeaf & 1),
                             (bool)(create->mQuantized & 1));
          if (bVar3) {
            pAVar2 = (this->super_BaseModel).mTree;
            uVar4 = (*pAVar2->_vptr_AABBOptimizedTree[2])(pAVar2,(this->super_BaseModel).mSource);
            if ((uVar4 & 1) == 0) {
              this_local._7_1_ = 0;
            }
            else {
              if (((create->mKeepOriginal & 1U) == 0) &&
                 ((this->super_BaseModel).mSource != (AABBTree *)0x0)) {
                pAVar5 = (this->super_BaseModel).mSource;
                if (pAVar5 != (AABBTree *)0x0) {
                  AABBTree::~AABBTree(pAVar5);
                  operator_delete(pAVar5,0x48);
                }
                (this->super_BaseModel).mSource = (AABBTree *)0x0;
              }
              this_local._7_1_ = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Model::Build(const OPCODECREATE& create)
{
	// 1) Checkings
	if(!create.mIMesh || !create.mIMesh->IsValid())	return false;

	// For this model, we only support complete trees
	if(create.mSettings.mLimit!=1)	return SetIceError("OPCODE WARNING: supports complete trees only! Use mLimit = 1.\n", null);

	// Look for degenerate faces.
	udword NbDegenerate = create.mIMesh->CheckTopology();
	if(NbDegenerate)	Log("OPCODE WARNING: found %d degenerate faces in model! Collision might report wrong results!\n", NbDegenerate);
	// We continue nonetheless.... 

	Release();	// Make sure previous tree has been discarded [Opcode 1.3, thanks Adam]

	// 1-1) Setup mesh interface automatically [Opcode 1.3]
	SetMeshInterface(create.mIMesh);

	// Special case for 1-triangle meshes [Opcode 1.3]
	udword NbTris = create.mIMesh->GetNbTriangles();
	if(NbTris==1)
	{
		// We don't need to actually create a tree here, since we'll only have a single triangle to deal with anyway.
		// It's a waste to use a "model" for this but at least it will work.
		mModelCode |= OPC_SINGLE_NODE;
		return true;
	}

	// 2) Build a generic AABB Tree.
	mSource = new AABBTree;
	CHECKALLOC(mSource);

	// 2-1) Setup a builder. Our primitives here are triangles from input mesh,
	// so we use an AABBTreeOfTrianglesBuilder.....
	{
		AABBTreeOfTrianglesBuilder TB;
		TB.mIMesh			= create.mIMesh;
		TB.mSettings		= create.mSettings;
		TB.mNbPrimitives	= NbTris;
		if(!mSource->Build(&TB))	return false;
	}

	// 3) Create an optimized tree according to user-settings
	if(!CreateTree(create.mNoLeaf, create.mQuantized))	return false;

	// 3-2) Create optimized tree
	if(!mTree->Build(mSource))	return false;

	// 3-3) Delete generic tree if needed
	if(!create.mKeepOriginal)	DELETESINGLE(mSource);

#ifdef __MESHMERIZER_H__
	// 4) Convex hull
	if(create.mCollisionHull)
	{
		// Create hull
		mHull = new CollisionHull;
		CHECKALLOC(mHull);

		CONVEXHULLCREATE CHC;
		// ### doesn't work with strides
		CHC.NbVerts			= create.mIMesh->GetNbVertices();
		CHC.Vertices		= create.mIMesh->GetVerts();
		CHC.UnifyNormals	= true;
		CHC.ReduceVertices	= true;
		CHC.WordFaces		= false;
		mHull->Compute(CHC);
	}
#endif // __MESHMERIZER_H__

	return true;
}